

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_freeCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *local_20;
  CallInfo *next;
  CallInfo *ci;
  lua_State *L_local;
  
  local_20 = L->ci->next;
  L->ci->next = (CallInfo *)0x0;
  while (local_20 != (CallInfo *)0x0) {
    pCVar1 = local_20->next;
    luaM_realloc_(L,local_20,0x48,0);
    L->nci = L->nci - 1;
    local_20 = pCVar1;
  }
  return;
}

Assistant:

void luaE_freeCI (lua_State *L) {
  CallInfo *ci = L->ci;
  CallInfo *next = ci->next;
  ci->next = NULL;
  L->nCcalls += L->nci;  /* add removed elements back to 'nCcalls' */
  while ((ci = next) != NULL) {
    next = ci->next;
    luaM_free(L, ci);
    L->nci--;
  }
  L->nCcalls -= L->nci;  /* adjust result */
}